

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O0

void __thiscall
embree::SceneGraph::PlyParser::loadPropertyList
          (PlyParser *this,
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *vec,Tag index_ty,Tag data_ty)

{
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *pvVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  value_type *in_RDI;
  size_t i;
  size_t num;
  vector<unsigned_long,_std::allocator<unsigned_long>_> lst;
  value_type_conflict5 *in_stack_ffffffffffffff88;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *this_01;
  undefined8 in_stack_ffffffffffffffb0;
  Tag ty;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *pvVar2;
  PlyParser *in_stack_ffffffffffffffb8;
  
  ty = (Tag)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x4074aa);
  pvVar1 = (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)loadInteger(in_stack_ffffffffffffffb8,ty);
  this_01 = pvVar1;
  for (pvVar2 = (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)0x0; pvVar2 < pvVar1;
      pvVar2 = (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                *)((long)&(pvVar2->
                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1)) {
    this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
              loadInteger(in_stack_ffffffffffffffb8,(Tag)((ulong)pvVar2 >> 0x20));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (this_00,in_stack_ffffffffffffff88);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::push_back(this_01,in_RDI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01);
  return;
}

Assistant:

void loadPropertyList(std::vector<std::vector<size_t> >& vec,Type::Tag index_ty,Type::Tag data_ty)
      {
        std::vector<size_t> lst;
        size_t num = loadInteger(index_ty);
        for (size_t i=0; i<num; i++) lst.push_back(loadInteger(data_ty));
        vec.push_back(lst);
      }